

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall
crunch::process_input_spec(crunch *this,file_desc_vec *files,dynamic_string *input_spec)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  dynamic_string find_name;
  find_files file_finder;
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_ext;
  dynamic_string find_fname;
  dynamic_string find_path;
  dynamic_string find_drive;
  dynamic_string dStack_a8;
  undefined1 local_98 [16];
  int64 local_88;
  dynamic_string local_80;
  dynamic_string local_70;
  dynamic_string local_60;
  dynamic_string local_50;
  dynamic_string local_40;
  dynamic_string local_30;
  
  crnlib::dynamic_string::dynamic_string(&dStack_a8,input_spec);
  if (dStack_a8.m_len != 0) {
    pcVar3 = dStack_a8.m_pStr;
    if (dStack_a8.m_pStr == (char *)0x0) {
      pcVar3 = "";
    }
    bVar1 = crnlib::file_utils::does_dir_exist(pcVar3);
    if (bVar1) {
      pcVar3 = dStack_a8.m_pStr;
      if (dStack_a8.m_pStr == (char *)0x0) {
        pcVar3 = "";
      }
      crnlib::file_utils::combine_path(&dStack_a8,pcVar3,"*");
    }
    if (dStack_a8.m_len != 0) {
      bVar1 = crnlib::file_utils::full_path(&dStack_a8);
      if (bVar1) {
        bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"deep",0,false);
        local_30.m_buf_size = 0;
        local_30.m_len = 0;
        local_30.m_pStr = (char *)0x0;
        local_40.m_buf_size = 0;
        local_40.m_len = 0;
        local_40.m_pStr = (char *)0x0;
        local_50.m_buf_size = 0;
        local_50.m_len = 0;
        local_50.m_pStr = (char *)0x0;
        local_60.m_buf_size = 0;
        local_60.m_len = 0;
        local_60.m_pStr = (char *)0x0;
        pcVar3 = dStack_a8.m_pStr;
        if (dStack_a8.m_pStr == (char *)0x0) {
          pcVar3 = "";
        }
        crnlib::file_utils::split_path(pcVar3,&local_30,&local_40,&local_50,&local_60);
        local_70.m_buf_size = 0;
        local_70.m_len = 0;
        local_70.m_pStr = (char *)0x0;
        pcVar3 = local_30.m_pStr;
        if (local_30.m_pStr == (char *)0x0) {
          pcVar3 = "";
        }
        pcVar2 = local_40.m_pStr;
        if (local_40.m_pStr == (char *)0x0) {
          pcVar2 = "";
        }
        crnlib::file_utils::combine_path(&local_70,pcVar3,pcVar2);
        local_80.m_buf_size = 0;
        local_80.m_len = 0;
        local_80.m_pStr = (char *)0x0;
        crnlib::operator+((crnlib *)local_98,&local_50,&local_60);
        crnlib::dynamic_string::operator=(&local_80,(dynamic_string *)local_98);
        crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_98);
        local_88 = 0;
        local_98._0_8_ = (file_desc *)0x0;
        local_98._8_8_ = (char *)0x0;
        pcVar3 = local_70.m_pStr;
        if (local_70.m_pStr == (char *)0x0) {
          pcVar3 = "";
        }
        pcVar2 = local_80.m_pStr;
        if (local_80.m_pStr == (char *)0x0) {
          pcVar2 = "";
        }
        bVar1 = crnlib::find_files::find((find_files *)local_98,pcVar3,pcVar2,bVar1 | 4);
        if (bVar1) {
          if (local_98._8_4_ == 0) {
            pcVar3 = "";
            if (dStack_a8.m_pStr != (char *)0x0) {
              pcVar3 = dStack_a8.m_pStr;
            }
            crnlib::console::warning("No files found: %s",pcVar3);
          }
          else {
            crnlib::vector<crnlib::find_files::file_desc>::append
                      (files,(vector<crnlib::find_files::file_desc> *)local_98);
          }
        }
        else {
          pcVar3 = "";
          if (dStack_a8.m_pStr != (char *)0x0) {
            pcVar3 = dStack_a8.m_pStr;
          }
          crnlib::console::error("Failed finding files: %s",pcVar3);
        }
        crnlib::vector<crnlib::find_files::file_desc>::~vector
                  ((vector<crnlib::find_files::file_desc> *)local_98);
        crnlib::dynamic_string::~dynamic_string(&local_80);
        crnlib::dynamic_string::~dynamic_string(&local_70);
        crnlib::dynamic_string::~dynamic_string(&local_60);
        crnlib::dynamic_string::~dynamic_string(&local_50);
        crnlib::dynamic_string::~dynamic_string(&local_40);
        crnlib::dynamic_string::~dynamic_string(&local_30);
        goto LAB_0010a421;
      }
    }
  }
  pcVar3 = "";
  if (dStack_a8.m_pStr != (char *)0x0) {
    pcVar3 = dStack_a8.m_pStr;
  }
  bVar1 = false;
  crnlib::console::error("Invalid input filename: %s",pcVar3);
LAB_0010a421:
  crnlib::dynamic_string::~dynamic_string(&dStack_a8);
  return bVar1;
}

Assistant:

bool process_input_spec(find_files::file_desc_vec& files, const dynamic_string& input_spec) {
    dynamic_string find_name(input_spec);

    if ((find_name.get_len()) && (file_utils::does_dir_exist(find_name.get_ptr()))) {
      file_utils::combine_path(find_name, find_name.get_ptr(), "*");
    }

    if ((find_name.is_empty()) || (!file_utils::full_path(find_name))) {
      console::error("Invalid input filename: %s", find_name.get_ptr());
      return false;
    }

    const bool deep_flag = m_params.get_value_as_bool("deep");

    dynamic_string find_drive, find_path, find_fname, find_ext;
    file_utils::split_path(find_name.get_ptr(), &find_drive, &find_path, &find_fname, &find_ext);

    dynamic_string find_pathname;
    file_utils::combine_path(find_pathname, find_drive.get_ptr(), find_path.get_ptr());
    dynamic_string find_filename;
    find_filename = find_fname + find_ext;

    find_files file_finder;
    bool success = file_finder.find(find_pathname.get_ptr(), find_filename.get_ptr(), find_files::cFlagAllowFiles | (deep_flag ? find_files::cFlagRecursive : 0));
    if (!success) {
      console::error("Failed finding files: %s", find_name.get_ptr());
      return false;
    }

    if (file_finder.get_files().empty()) {
      console::warning("No files found: %s", find_name.get_ptr());
      return true;
    }

    files.append(file_finder.get_files());

    return true;
  }